

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

int __thiscall
Rml::StringUtilities::ConvertByteOffsetToCharacterOffset
          (StringUtilities *this,StringView string,int byte_offset)

{
  int iVar1;
  StringIteratorU8 it;
  StringIteratorU8 local_30;
  
  StringIteratorU8::StringIteratorU8(&local_30,(char *)this,(char *)this,string.p_begin);
  iVar1 = 0;
  while( true ) {
    if (((local_30.p == local_30.view.p_begin + -1) || (local_30.p == local_30.view.p_end)) ||
       ((long)(int)string.p_end <= (long)local_30.p - (long)local_30.view.p_begin)) break;
    iVar1 = iVar1 + 1;
    StringIteratorU8::operator++(&local_30);
  }
  return iVar1;
}

Assistant:

int StringUtilities::ConvertByteOffsetToCharacterOffset(StringView string, int byte_offset)
{
	int character_count = 0;
	for (auto it = StringIteratorU8(string.begin(), string.begin(), string.end()); it; ++it)
	{
		if (it.offset() >= byte_offset)
			break;
		character_count += 1;
	}
	return character_count;
}